

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::anon_unknown_8::LogFileObject::FlushUnlocked(LogFileObject *this,time_point *now)

{
  time_point *__lhs;
  bool bVar1;
  FILE *__stream;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar2;
  duration<int,_std::ratio<1L,_1L>_> local_2c;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28 [2];
  time_point *local_18;
  time_point *now_local;
  LogFileObject *this_local;
  
  local_18 = now;
  now_local = (time_point *)this;
  bVar1 = std::operator!=(&this->file_,(nullptr_t)0x0);
  if (bVar1) {
    __stream = (FILE *)std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::get(&this->file_);
    fflush(__stream);
    this->bytes_since_flush_ = 0;
  }
  __lhs = local_18;
  std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
            ((duration<int,std::ratio<1l,1l>> *)&local_2c,&fLI::FLAGS_logbufsecs);
  local_28[0].__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,int,std::ratio<1l,1l>>
                      (&local_2c);
  tVar2 = std::chrono::operator+(__lhs,local_28);
  (this->next_flush_time_).__d.__r = (rep)tVar2.__d.__r;
  return;
}

Assistant:

void LogFileObject::FlushUnlocked(
    const std::chrono::system_clock::time_point& now) {
  if (file_ != nullptr) {
    fflush(file_.get());
    bytes_since_flush_ = 0;
  }
  // Figure out when we are due for another flush.
  next_flush_time_ =
      now + std::chrono::duration_cast<std::chrono::system_clock::duration>(
                std::chrono::duration<int32>{FLAGS_logbufsecs});
}